

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O0

void start_output_pass(j_decompress_ptr cinfo)

{
  jpeg_d_coef_controller *pjVar1;
  boolean bVar2;
  my_coef_ptr coef;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->coef;
  if (pjVar1->coef_arrays != (jvirt_barray_ptr *)0x0) {
    if ((cinfo->do_block_smoothing == 0) || (bVar2 = smoothing_ok(cinfo), bVar2 == 0)) {
      pjVar1->decompress_data = decompress_data;
    }
    else {
      pjVar1->decompress_data = decompress_smooth_data;
    }
  }
  cinfo->output_iMCU_row = 0;
  return;
}

Assistant:

METHODDEF(void)
start_output_pass (j_decompress_ptr cinfo)
{
#ifdef BLOCK_SMOOTHING_SUPPORTED
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;

  /* If multipass, check to see whether to use block smoothing on this pass */
  if (coef->pub.coef_arrays != NULL) {
    if (cinfo->do_block_smoothing && smoothing_ok(cinfo))
      coef->pub.decompress_data = decompress_smooth_data;
    else
      coef->pub.decompress_data = decompress_data;
  }
#endif
  cinfo->output_iMCU_row = 0;
}